

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O0

void duckdb::UDFSum::Finalize<duckdb::UDFSum::sum_state_t,double>
               (Vector *states,AggregateInputData *param_2,Vector *result,idx_t count,idx_t offset)

{
  VectorType VVar1;
  anon_struct_16_2_bf530190 **ppaVar2;
  Vector *pVVar3;
  ulong in_RCX;
  Vector *in_RDX;
  Vector *in_RDI;
  idx_t i;
  double *rdata_1;
  anon_struct_16_2_bf530190 **sdata_1;
  double *rdata;
  anon_struct_16_2_bf530190 **sdata;
  ValidityMask *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  Vector *target;
  anon_struct_16_2_bf530190 *in_stack_ffffffffffffff88;
  anon_struct_16_2_bf530190 *state;
  Vector *in_stack_ffffffffffffff90;
  Vector *result_00;
  ulong local_50;
  
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    ConstantVector::GetData<duckdb::UDFSum::sum_state_t*>((Vector *)0x510240);
    ConstantVector::GetData<double>((Vector *)0x51024f);
    ConstantVector::Validity(in_RDX);
    Finalize<double,duckdb::UDFSum::sum_state_t>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,0x51029b);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    ppaVar2 = FlatVector::GetData<duckdb::UDFSum::sum_state_t*>((Vector *)0x5102b9);
    pVVar3 = (Vector *)FlatVector::GetData<double>((Vector *)0x5102c8);
    for (local_50 = 0; local_50 < in_RCX; local_50 = local_50 + 1) {
      state = ppaVar2[local_50];
      target = in_RDX;
      result_00 = pVVar3;
      FlatVector::Validity((Vector *)0x510313);
      Finalize<double,duckdb::UDFSum::sum_state_t>
                (result_00,state,(double *)target,in_stack_ffffffffffffff78,0x510334);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			UDFSum::Finalize<RESULT_TYPE, STATE_TYPE>(result, *sdata, rdata, ConstantVector::Validity(result), 0);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			for (idx_t i = 0; i < count; i++) {
				UDFSum::Finalize<RESULT_TYPE, STATE_TYPE>(result, sdata[i], rdata, FlatVector::Validity(result),
				                                          i + offset);
			}
		}
	}